

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-matchers.h
# Opt level: O0

bool __thiscall
testing::internal::AnyEq::operator()
          (AnyEq *this,basic_string_view<char,_std::char_traits<char>_> *a,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *b)

{
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y;
  basic_string_view<char,_std::char_traits<char>_> __x;
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *b_local;
  basic_string_view<char,_std::char_traits<char>_> *a_local;
  AnyEq *this_local;
  
  __x = *a;
  __y = (__type_identity_t<basic_string_view<char,_char_traits<char>_>_>)
        std::__cxx11::string::operator_cast_to_basic_string_view((string *)b);
  bVar1 = std::operator==(__x,__y);
  return bVar1;
}

Assistant:

bool operator()(const A& a, const B& b) const { return a == b; }